

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcommon.c
# Opt level: O1

void parse_arguments(arguments *args,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  size_t sVar3;
  void *__ptr;
  uint uVar4;
  char *__filename;
  undefined8 *puVar5;
  
  *(undefined8 *)&args->field_0x10 = 0;
  args->mainfunc = (char *)0x0;
  args->filename = (char *)0x0;
  args->code = (char *)0x0;
  *(ushort *)&args->field_0x10 = (ushort)*(undefined4 *)&args->field_0x10 & 0xf800 | 0x3f;
  args->mainfunc = "setup";
  if (1 < argc) {
    uVar4 = 1;
    do {
      pcVar2 = argv[(int)uVar4];
      iVar1 = strcmp(pcVar2,"--notypecheck");
      if (iVar1 == 0) {
        args->field_0x10 = args->field_0x10 & 0xfe;
      }
      else {
        iVar1 = strcmp(pcVar2,"--nolinearize");
        if (iVar1 == 0) {
          args->field_0x10 = args->field_0x10 & 0xfd;
        }
        else {
          iVar1 = strcmp(pcVar2,"--noastdump");
          if (iVar1 == 0) {
            args->field_0x10 = args->field_0x10 & 0xfb;
          }
          else {
            iVar1 = strcmp(pcVar2,"--noirdump");
            if (iVar1 == 0) {
              args->field_0x10 = args->field_0x10 & 0xf7;
            }
            else {
              iVar1 = strcmp(pcVar2,"--nocodump");
              if (iVar1 == 0) {
                args->field_0x10 = args->field_0x10 & 0xdf;
              }
              else {
                iVar1 = strcmp(pcVar2,"--nocfgdump");
                if (iVar1 == 0) {
                  args->field_0x10 = args->field_0x10 & 0xef;
                }
                else {
                  iVar1 = strcmp(pcVar2,"--simplify-ast");
                  if (iVar1 == 0) {
                    args->field_0x10 = args->field_0x10 | 0x40;
                  }
                  else {
                    iVar1 = strcmp(pcVar2,"--remove-unreachable-blocks");
                    if (iVar1 == 0) {
                      args->field_0x10 = args->field_0x10 | 0x80;
                    }
                    else {
                      iVar1 = strcmp(pcVar2,"--gen-C");
                      if (iVar1 == 0) {
                        args->field_0x11 = args->field_0x11 | 1;
                      }
                      else {
                        iVar1 = strcmp(pcVar2,"--opt-upvalues");
                        if (iVar1 == 0) {
                          args->field_0x11 = args->field_0x11 | 2;
                        }
                        else {
                          iVar1 = strcmp(pcVar2,"--table-ast");
                          if (iVar1 == 0) {
                            args->field_0x11 = args->field_0x11 | 4;
                          }
                          else {
                            __filename = pcVar2;
                            iVar1 = strcmp(pcVar2,"-main");
                            if (iVar1 == 0) {
                              if (argc + -1 <= (int)uVar4) {
LAB_00106034:
                                parse_arguments_cold_4();
LAB_00106039:
                                parse_arguments_cold_3();
                                __stream = fopen(__filename,"r");
                                if (__stream == (FILE *)0x0) {
                                  fprintf(_stderr,"Failed to open file %s\n",__filename);
                                }
                                else {
                                  iVar1 = fseek(__stream,0,2);
                                  if (iVar1 == 0) {
                                    sVar3 = ftell(__stream);
                                    iVar1 = fseek(__stream,0,0);
                                    if (iVar1 == 0) {
                                      puVar5 = (undefined8 *)0x1;
                                      __ptr = calloc(1,sVar3 + 10);
                                      if (__ptr == (void *)0x0) {
                                        read_file_cold_4();
                                        free((void *)*puVar5);
                                        free((void *)puVar5[1]);
                                        return;
                                      }
                                      sVar3 = fread(__ptr,1,sVar3,__stream);
                                      if (sVar3 == 0) {
                                        read_file_cold_3();
                                      }
                                      else {
                                        fclose(__stream);
                                      }
                                    }
                                    else {
                                      read_file_cold_2();
                                    }
                                  }
                                  else {
                                    read_file_cold_1();
                                  }
                                }
                                return;
                              }
                              pcVar2 = strdup(argv[(long)(int)uVar4 + 1]);
                              args->mainfunc = pcVar2;
                              uVar4 = uVar4 + 1;
                            }
                            else {
                              __filename = pcVar2;
                              iVar1 = strcmp(pcVar2,"-f");
                              if (iVar1 == 0) {
                                if (args->filename == (char *)0x0) {
                                  if (argc + -1 <= (int)uVar4) goto LAB_00106039;
                                  pcVar2 = strdup(argv[(long)(int)uVar4 + 1]);
                                  args->filename = pcVar2;
                                  uVar4 = uVar4 + 1;
                                }
                                else {
                                  parse_arguments_cold_2();
                                }
                              }
                              else {
                                if (args->code != (char *)0x0) {
                                  __filename = (char *)(ulong)uVar4;
                                  parse_arguments_cold_1();
                                  goto LAB_00106034;
                                }
                                pcVar2 = strdup(pcVar2);
                                args->code = pcVar2;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < argc);
  }
  if ((args->filename != (char *)0x0) && (args->code == (char *)0x0)) {
    pcVar2 = read_file(args->filename);
    args->code = pcVar2;
  }
  return;
}

Assistant:

void parse_arguments(struct arguments *args, int argc, const char *argv[])
{
	memset(args, 0, sizeof *args);
	args->typecheck = 1;
	args->linearize = 1;
	args->astdump = 1;
	args->irdump = 1;
	args->cfgdump = 1;
	args->codump = 1;
	args->table_ast = 0;
	args->simplify_ast = 0;
	args->remove_unreachable_blocks = 0;
	args->gen_C = 0;
	args->opt_upvalue = 0;
	args->mainfunc = "setup";
	for (int i = 1; i < argc; i++) {
		if (strcmp(argv[i], "--notypecheck") == 0) {
			args->typecheck = 0;
		} else if (strcmp(argv[i], "--nolinearize") == 0) {
			args->linearize = 0;
		} else if (strcmp(argv[i], "--noastdump") == 0) {
			args->astdump = 0;
		} else if (strcmp(argv[i], "--noirdump") == 0) {
			args->irdump = 0;
		} else if (strcmp(argv[i], "--nocodump") == 0) {
			args->codump = 0;
		} else if (strcmp(argv[i], "--nocfgdump") == 0) {
			args->cfgdump = 0;
		} else if (strcmp(argv[i], "--simplify-ast") == 0) {
			args->simplify_ast = 1;
		} else if (strcmp(argv[i], "--remove-unreachable-blocks") == 0) {
			args->remove_unreachable_blocks = 1;
		} else if (strcmp(argv[i], "--gen-C") == 0) {
			args->gen_C = 1;
		} else if (strcmp(argv[i], "--opt-upvalues") == 0) {
			args->opt_upvalue = 1;
		} else if (strcmp(argv[i], "--table-ast") == 0) {
			args->table_ast = 1;
		} else if (strcmp(argv[i], "-main") == 0) {
			if (i < argc - 1) {
				i++;
				args->mainfunc = strdup(argv[i]);
			} else {
				fprintf(stderr, "Missing argument after -main\n");
				exit(1);
			}
		} else if (strcmp(argv[i], "-f") == 0) {
			if (args->filename) {
				fprintf(stderr, "-f already accepted\n");
				continue;
			}
			if (i < argc - 1) {
				i++;
				args->filename = strdup(argv[i]);
			} else {
				fprintf(stderr, "Missing file name after -f\n");
				exit(1);
			}
		} else {
			if (args->code) {
				fprintf(stderr, "Bad argument at %d", i);
				exit(1);
			} else {
				args->code = strdup(argv[i]);
			}
		}
	}
	if (args->filename && !args->code) {
		args->code = read_file(args->filename);
	}
}